

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pk.c
# Opt level: O1

int mbedtls_pk_debug(mbedtls_pk_context *ctx,mbedtls_pk_debug_item *items)

{
  _func_void_mbedtls_pk_context_ptr_mbedtls_pk_debug_item_ptr *p_Var1;
  
  if (ctx->pk_info == (mbedtls_pk_info_t *)0x0) {
    return -16000;
  }
  p_Var1 = ctx->pk_info->debug_func;
  if (p_Var1 != (_func_void_mbedtls_pk_context_ptr_mbedtls_pk_debug_item_ptr *)0x0) {
    (*p_Var1)(ctx,items);
    return 0;
  }
  return -0x3f00;
}

Assistant:

int mbedtls_pk_debug(const mbedtls_pk_context *ctx, mbedtls_pk_debug_item *items)
{
    if (ctx->pk_info == NULL) {
        return MBEDTLS_ERR_PK_BAD_INPUT_DATA;
    }

    if (ctx->pk_info->debug_func == NULL) {
        return MBEDTLS_ERR_PK_TYPE_MISMATCH;
    }

    ctx->pk_info->debug_func((mbedtls_pk_context *) ctx, items);
    return 0;
}